

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

cmpResult __thiscall llvm::detail::IEEEFloat::compareAbsoluteValue(IEEEFloat *this,IEEEFloat *rhs)

{
  uint uVar1;
  cmpResult cVar2;
  Significand *rhs_00;
  Significand *lhs;
  
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4a8,
                  "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
                 );
  }
  if (((this->field_0x12 & 6) != 0) && ((this->field_0x12 & 7) != 3)) {
    if (((rhs->field_0x12 & 6) != 0) && ((rhs->field_0x12 & 7) != 3)) {
      uVar1 = (int)this->exponent - (int)rhs->exponent;
      if (uVar1 == 0) {
        uVar1 = this->semantics->precision;
        if (uVar1 - 0x40 < 0xffffff80) {
          lhs = (Significand *)(this->significand).parts;
        }
        else {
          lhs = &this->significand;
        }
        if (rhs->semantics->precision - 0x40 < 0xffffff80) {
          rhs_00 = (Significand *)(rhs->significand).parts;
        }
        else {
          rhs_00 = &rhs->significand;
        }
        uVar1 = APInt::tcCompare(&lhs->part,&rhs_00->part,uVar1 + 0x40 >> 6);
      }
      cVar2 = cmpGreaterThan;
      if ((int)uVar1 < 1) {
        cVar2 = ~uVar1 >> 0x1f;
      }
      return cVar2;
    }
    __assert_fail("rhs.isFiniteNonZero()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4aa,
                  "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
                 );
  }
  __assert_fail("isFiniteNonZero()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x4a9,
                "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
               );
}

Assistant:

IEEEFloat::cmpResult
IEEEFloat::compareAbsoluteValue(const IEEEFloat &rhs) const {
  int compare;

  assert(semantics == rhs.semantics);
  assert(isFiniteNonZero());
  assert(rhs.isFiniteNonZero());

  compare = exponent - rhs.exponent;

  /* If exponents are equal, do an unsigned bignum comparison of the
     significands.  */
  if (compare == 0)
    compare = APInt::tcCompare(significandParts(), rhs.significandParts(),
                               partCount());

  if (compare > 0)
    return cmpGreaterThan;
  else if (compare < 0)
    return cmpLessThan;
  else
    return cmpEqual;
}